

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O2

uint32_t cpu_ppc601_load_rtcu_ppc(CPUPPCState_conflict *env)

{
  ppc_tb_t *ppVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  long lVar4;
  
  ppVar1 = env->tb_env;
  uVar3 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  auVar2 = ZEXT416(ppVar1->tb_freq) * auVar2;
  lVar4 = __udivti3(auVar2._0_8_,auVar2._8_8_,1000000000,0);
  return (uint32_t)((ulong)(lVar4 + ppVar1->tb_offset) >> 0x20);
}

Assistant:

uint32_t cpu_ppc601_load_rtcu (CPUPPCState *env)
{
    return _cpu_ppc_load_tbu(env);
}